

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O3

void __thiscall NanoVM::NanoVM(NanoVM *this,string *fileName)

{
  uchar *puVar1;
  char cVar2;
  uint64_t uVar3;
  uchar *puVar4;
  ulong uVar5;
  ifstream file;
  char acStack_218 [520];
  
  (this->cpu).codeSize = 0;
  (this->cpu).stackSize = 0;
  (this->cpu).codeBase = (uchar *)0x0;
  (this->cpu).stackBase = (uchar *)0x0;
  (this->cpu).registers[8] = 0;
  (this->cpu).registers[9] = 0;
  (this->cpu).registers[6] = 0;
  (this->cpu).registers[7] = 0;
  (this->cpu).registers[4] = 0;
  (this->cpu).registers[5] = 0;
  (this->cpu).registers[2] = 0;
  (this->cpu).registers[3] = 0;
  (this->cpu).registers[0] = 0;
  (this->cpu).registers[1] = 0;
  (this->cpu).bytecodeSize = 0;
  std::ifstream::ifstream(acStack_218,(string *)fileName,_S_in|_S_bin|_S_ate);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to open file",0x13);
  }
  else {
    uVar3 = std::istream::tellg();
    uVar5 = uVar3 + 0xfff;
    if (-1 < (long)uVar3) {
      uVar5 = uVar3;
    }
    (this->cpu).codeSize = (uVar5 & 0xfffffffffffff000) + 0x1000;
    (this->cpu).stackSize = 0x1000;
    puVar4 = (uchar *)malloc((uVar5 & 0xfffffffffffff000) + 0x200a);
    (this->cpu).codeBase = puVar4;
    std::istream::seekg((long)acStack_218,_S_beg);
    std::istream::read(acStack_218,(long)(this->cpu).codeBase);
    std::ifstream::close();
    (this->cpu).bytecodeSize = uVar3;
    puVar1 = (this->cpu).codeBase;
    uVar3 = (this->cpu).codeSize;
    (this->cpu).stackBase = puVar1 + uVar3;
    puVar4 = puVar1 + uVar3;
    puVar4[0] = '\0';
    puVar4[1] = '\0';
    puVar4[2] = '\0';
    puVar4[3] = '\0';
    puVar4[4] = '\0';
    puVar4[5] = '\0';
    puVar4[6] = '\0';
    puVar4[7] = '\0';
    puVar4[8] = '\0';
    puVar4[9] = '\0';
    puVar4[10] = '\0';
    puVar4[0xb] = '\0';
    puVar4[0xc] = '\0';
    puVar4[0xd] = '\0';
    puVar4[0xe] = '\0';
    puVar4[0xf] = '\0';
    (puVar1 + uVar3 + 0x10)[0] = '\0';
    (puVar1 + uVar3 + 0x10)[1] = '\0';
    uVar3 = (this->cpu).codeSize;
    (this->cpu).registers[7] = uVar3;
    (this->cpu).registers[6] = uVar3;
    (this->cpu).registers[8] = 0;
  }
  std::ifstream::~ifstream(acStack_218);
  return;
}

Assistant:

NanoVM::NanoVM(std::string fileName) {
	memset(&cpu, 0x00, sizeof(cpu));
	// Zero out registers
	memset(cpu.registers, 0x00, sizeof(cpu.registers));

	std::streampos size;

	std::ifstream file(fileName, std::ios::in | std::ios::binary | std::ios::ate);
	if (file.is_open())
	{
		size = file.tellg();

		cpu.codeSize = (NANOVM_PAGE_SIZE * (1 + (size / NANOVM_PAGE_SIZE)));
		cpu.stackSize = NANOVM_PAGE_SIZE;

		// allocate whole memory, code pages, stack, +10 bytes
		// +10 bytes is for instruction fetching which might read more bytes than the instruction size
		// This avoids reading memory out side of the VM
		cpu.codeBase = (unsigned char*)malloc(cpu.stackSize + 10 + cpu.codeSize);

		file.seekg(0, std::ios::beg);
		file.read((char*)cpu.codeBase, size);
		file.close();

		cpu.bytecodeSize = size;
		// Set stack base. Stack grows up instead of down like in x86
		cpu.stackBase = cpu.codeBase + cpu.codeSize;
		// Zero out stack + the last 10 bytes
		memset(cpu.stackBase, 0x00, sizeof(cpu.stackSize) + 10);
		cpu.registers[esp] = cpu.codeSize;
		cpu.registers[bp] = cpu.codeSize;
		// Set IP to the beginning of code
		cpu.registers[ip] = 0;
	}
	else std::cout << "Unable to open file";
}